

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::LengthGraphemeFun::GetFunctions(void)

{
  LogicalType varargs;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe0c;
  FunctionNullHandling in_stack_fffffffffffffe18;
  bind_lambda_function_t in_stack_fffffffffffffe20;
  scalar_function_t local_1d8;
  LogicalType local_1b8;
  LogicalType local_1a0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_188;
  LogicalType local_170;
  string local_158;
  ScalarFunction local_138;
  
  ::std::__cxx11::string::string((string *)&local_158,"length_grapheme",(allocator *)&local_1b8);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_158);
  ::std::__cxx11::string::~string((string *)&local_158);
  LogicalType::LogicalType(&local_1b8,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_1b8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_188,__l,(allocator_type *)&stack0xfffffffffffffe27);
  LogicalType::LogicalType(&local_1a0,BIGINT);
  local_1d8.super__Function_base._M_functor._8_8_ = 0;
  local_1d8.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::UnaryFunction<duckdb::string_t,long,duckdb::GraphemeCountOperator>;
  local_1d8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_1d8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_170,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_170;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffe04;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffe0c;
  ScalarFunction::ScalarFunction
            (&local_138,(vector<duckdb::LogicalType,_true> *)&local_188,&local_1a0,&local_1d8,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,LengthPropagateStats,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe20);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_138);
  ScalarFunction::~ScalarFunction(&local_138);
  LogicalType::~LogicalType(&local_170);
  ::std::_Function_base::~_Function_base(&local_1d8.super__Function_base);
  LogicalType::~LogicalType(&local_1a0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_188);
  LogicalType::~LogicalType(&local_1b8);
  return in_RDI;
}

Assistant:

ScalarFunctionSet LengthGraphemeFun::GetFunctions() {
	ScalarFunctionSet length_grapheme("length_grapheme");
	length_grapheme.AddFunction(ScalarFunction({LogicalType::VARCHAR}, LogicalType::BIGINT,
	                                           ScalarFunction::UnaryFunction<string_t, int64_t, GraphemeCountOperator>,
	                                           nullptr, nullptr, LengthPropagateStats));
	return (length_grapheme);
}